

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::PointerPrinter::PrintValue<unsigned_int>(uint *p,ostream *os)

{
  if (p != (uint *)0x0) {
    std::ostream::_M_insert<void_const*>(os);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
  return;
}

Assistant:

static void PrintValue(T* p, ::std::ostream* os) {
    if (p == nullptr) {
      *os << "NULL";
    } else {
      // T is not a function type.  We just call << to print p,
      // relying on ADL to pick up user-defined << for their pointer
      // types, if any.
      *os << p;
    }
  }